

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

Button * __thiscall Button::writeXml_abi_cxx11_(Button *this,int indent)

{
  ostream *poVar1;
  int in_EDX;
  undefined4 in_register_00000034;
  Widget *this_00;
  Util local_3e0 [32];
  string local_3c0 [39];
  allocator local_399;
  string local_398 [32];
  Util local_378 [32];
  string local_358 [39];
  allocator local_331;
  string local_330 [32];
  Util local_310 [32];
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [32];
  Util local_2a8 [32];
  string local_288 [39];
  allocator local_261;
  string local_260 [32];
  Util local_240 [39];
  allocator local_219;
  string local_218 [32];
  Util local_1f8 [48];
  Util local_1c8 [32];
  stringstream local_1a8 [8];
  stringstream str;
  ostream local_198 [380];
  int local_1c;
  Widget *pWStack_18;
  int indent_local;
  Button *this_local;
  
  this_00 = (Widget *)CONCAT44(in_register_00000034,indent);
  local_1c = in_EDX;
  pWStack_18 = this_00;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  Util::getIndent_abi_cxx11_(local_1c8,local_1c);
  poVar1 = std::operator<<(local_198,(string *)local_1c8);
  std::operator<<(poVar1,"<Button");
  std::__cxx11::string::~string((string *)local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"isTextButton",&local_219);
  Util::writeXmlAttribute<bool>
            (local_1f8,(stringstream *)local_1a8,(string *)local_218,
             (bool)(*(byte *)((long)&this_00[1]._vptr_Widget + 4) & 1));
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"text",&local_261);
  std::__cxx11::string::string(local_288,(string *)&this_00[1].numChildren);
  Util::writeXmlAttribute<std::__cxx11::string>
            (local_240,(stringstream *)local_1a8,(string *)local_260,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288);
  std::__cxx11::string::~string((string *)local_240);
  std::__cxx11::string::~string(local_288);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"backgroundNormalImage",&local_2c9);
  std::__cxx11::string::string(local_2f0,(string *)&this_00[1].type);
  Util::writeXmlAttribute<std::__cxx11::string>
            (local_2a8,(stringstream *)local_1a8,(string *)local_2c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0);
  std::__cxx11::string::~string((string *)local_2a8);
  std::__cxx11::string::~string(local_2f0);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_330,"backgroundPressedImage",&local_331);
  std::__cxx11::string::string(local_358,(string *)&this_00[1].field_0x48);
  Util::writeXmlAttribute<std::__cxx11::string>
            (local_310,(stringstream *)local_1a8,(string *)local_330,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
  std::__cxx11::string::~string((string *)local_310);
  std::__cxx11::string::~string(local_358);
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"backgroundDisabledImage",&local_399);
  std::__cxx11::string::string(local_3c0,(string *)&this_00[1].field_0x68);
  Util::writeXmlAttribute<std::__cxx11::string>
            (local_378,(stringstream *)local_1a8,(string *)local_398,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0);
  std::__cxx11::string::~string((string *)local_378);
  std::__cxx11::string::~string(local_3c0);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  Widget::writeXmlAttributes(this_00,(stringstream *)local_1a8);
  if (this_00->numChildren == 0) {
    std::operator<<(local_198,"/>");
  }
  else {
    poVar1 = std::operator<<(local_198,">");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    Widget::writeXmlChildren(this_00,(stringstream *)local_1a8,local_1c + 1);
    Util::getIndent_abi_cxx11_(local_3e0,local_1c);
    poVar1 = std::operator<<(local_198,(string *)local_3e0);
    std::operator<<(poVar1,"</Button>");
    std::__cxx11::string::~string((string *)local_3e0);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

std::string Button::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<Button";
	Util::writeXmlAttribute(str, "isTextButton", isTextButton);
	Util::writeXmlAttribute(str, "text", text);
	Util::writeXmlAttribute(str, "backgroundNormalImage", backgroundNormalImage);
	Util::writeXmlAttribute(str, "backgroundPressedImage", backgroundPressedImage);
	Util::writeXmlAttribute(str, "backgroundDisabledImage", backgroundDisabledImage);
	writeXmlAttributes(str);

	if (numChildren == 0)
		str << "/>";
	else
	{
		str << ">" << std::endl;

		Widget::writeXmlChildren(str, indent + 1);

		str << Util::getIndent(indent) << "</Button>";
	}

	return str.str();
}